

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

bool __thiscall QTextDocumentPrivate::split(QTextDocumentPrivate *this,int pos)

{
  uint uVar1;
  QTextFragmentData *pQVar2;
  QTextFragmentData *pQVar3;
  uint in_ESI;
  QFragmentMap<QTextFragmentData> *in_RDI;
  QTextFragmentData *N;
  uint n;
  int oldsize;
  QTextFragmentData *X;
  int k;
  uint x;
  uint in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  quint32 qVar4;
  bool local_1;
  
  uVar1 = QFragmentMap<QTextFragmentData>::findNode
                    (in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  if ((uVar1 == 0) ||
     (uVar1 = QFragmentMap<QTextFragmentData>::position
                        (in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
     uVar1 == in_ESI)) {
    local_1 = false;
  }
  else {
    pQVar2 = QFragmentMap<QTextFragmentData>::fragment(in_RDI,in_stack_ffffffffffffffbc);
    qVar4 = (pQVar2->super_QFragment<1>).size_array[0];
    QFragmentMap<QTextFragmentData>::setSize
              ((QFragmentMap<QTextFragmentData> *)CONCAT44(qVar4,in_stack_ffffffffffffffd0),
               (uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(int)in_stack_ffffffffffffffc8,
               (uint)((ulong)in_RDI >> 0x20));
    QFragmentMap<QTextFragmentData>::insert_single
              ((QFragmentMap<QTextFragmentData> *)CONCAT44(qVar4,in_stack_ffffffffffffffd0),
               (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(uint)in_stack_ffffffffffffffc8);
    pQVar2 = QFragmentMap<QTextFragmentData>::fragment(in_RDI,in_stack_ffffffffffffffbc);
    pQVar3 = QFragmentMap<QTextFragmentData>::fragment(in_RDI,in_stack_ffffffffffffffbc);
    pQVar3->stringPosition = (pQVar2->stringPosition + in_ESI) - uVar1;
    pQVar3->format = pQVar2->format;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool QTextDocumentPrivate::split(int pos)
{
    uint x = fragments.findNode(pos);
    if (x) {
        int k = fragments.position(x);
//          qDebug("found fragment with key %d, size_left=%d, size=%d to split at %d",
//                k, (*it)->size_left[0], (*it)->size_array[0], pos);
        if (k != pos) {
            Q_ASSERT(k <= pos);
            // need to resize the first fragment and add a new one
            QTextFragmentData *X = fragments.fragment(x);
            int oldsize = X->size_array[0];
            fragments.setSize(x, pos-k);
            uint n = fragments.insert_single(pos, oldsize-(pos-k));
            X = fragments.fragment(x);
            QTextFragmentData *N = fragments.fragment(n);
            N->stringPosition = X->stringPosition + pos-k;
            N->format = X->format;
            return true;
        }
    }
    return false;
}